

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

int utf8_isInvalid3(ENCODING *enc,char *p)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  
  bVar1 = p[2];
  if (-1 < (char)bVar1) {
    return 1;
  }
  cVar2 = *p;
  if (cVar2 == -0x11) {
    bVar3 = p[1];
    if (bVar3 != 0xbf) {
      if (0xbf < bVar1) {
        return 1;
      }
      goto LAB_004e6353;
    }
    bVar3 = 0xbf;
    if (0xbd < bVar1) {
      return 1;
    }
  }
  else {
    if (0xbf < bVar1) {
      return 1;
    }
    bVar3 = p[1];
    if (cVar2 == -0x20) {
      bVar4 = (byte)(bVar3 + 0x40) < 0xe0;
      goto LAB_004e6369;
    }
LAB_004e6353:
    bVar4 = true;
    if (-1 < (char)bVar3) goto LAB_004e6369;
  }
  bVar4 = (byte)((cVar2 != -0x13) << 5 | 0x9fU) < bVar3;
LAB_004e6369:
  return (int)bVar4;
}

Assistant:

static int PTRFASTCALL
utf8_isInvalid3(const ENCODING *enc, const char *p) {
  UNUSED_P(enc);
  return UTF8_INVALID3((const unsigned char *)p);
}